

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O2

void __thiscall
fmt::v11::detail::buffer<char>::append<char>(buffer<char> *this,char *begin,char *end)

{
  char *pcVar1;
  make_unsigned_t<long> mVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  
  for (; begin != end; begin = begin + uVar4) {
    mVar2 = to_unsigned<long>((long)end - (long)begin);
    sVar5 = this->size_;
    uVar3 = this->capacity_;
    if (uVar3 < sVar5 + mVar2) {
      (*this->grow_)(this,sVar5 + mVar2);
      sVar5 = this->size_;
      uVar3 = this->capacity_;
    }
    uVar4 = uVar3 - sVar5;
    if (mVar2 <= uVar3 - sVar5) {
      uVar4 = mVar2;
    }
    pcVar1 = this->ptr_;
    for (mVar2 = 0; uVar4 != mVar2; mVar2 = mVar2 + 1) {
      pcVar1[mVar2 + sVar5] = begin[mVar2];
    }
    this->size_ = this->size_ + uVar4;
  }
  return;
}

Assistant:

void
      append(const U* begin, const U* end) {
    while (begin != end) {
      auto count = to_unsigned(end - begin);
      try_reserve(size_ + count);
      auto free_cap = capacity_ - size_;
      if (free_cap < count) count = free_cap;
      // A loop is faster than memcpy on small sizes.
      T* out = ptr_ + size_;
      for (size_t i = 0; i < count; ++i) out[i] = begin[i];
      size_ += count;
      begin += count;
    }
  }